

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Handle.cpp
# Opt level: O2

bool remote::WriteProcessMemory
               (Handle hProcess,void *lpBaseAddress,void *lpBuffer,size_t nSize,
               size_t *lpNumberOfBytesWritten)

{
  bool bVar1;
  size_t sVar2;
  Region reg;
  Handle local_a4;
  Region local_a0;
  
  local_a4.pid = hProcess.pid;
  bVar1 = Handle::IsRunning(&local_a4);
  if (bVar1) {
    Handle::GetRegionByAddress(&local_a0,&local_a4,(size_t)lpBaseAddress);
    if ((local_a0.start + local_a0.end == 0) ||
       (sVar2 = Handle::WriteMemory(&local_a4,lpBaseAddress,lpBuffer,nSize),
       sVar2 == 0xffffffffffffffff)) {
      bVar1 = false;
    }
    else {
      if (lpNumberOfBytesWritten != (size_t *)0x0) {
        *lpNumberOfBytesWritten = sVar2;
      }
      bVar1 = sVar2 == nSize;
    }
    Region::~Region(&local_a0);
    return bVar1;
  }
  return false;
}

Assistant:

bool remote::WriteProcessMemory(Handle hProcess, void* lpBaseAddress, void* lpBuffer, size_t nSize, size_t* lpNumberOfBytesWritten) {
    if(!hProcess.IsRunning())
        return false;

    // Try to prevent them reading or writing to invalid memory
    Region reg = hProcess.GetRegionByAddress((size_t) lpBaseAddress);

    if(reg.start + reg.end == 0)
        return false;

    ssize_t result = hProcess.WriteMemory(lpBaseAddress, lpBuffer, nSize);

    if(result == -1)
        return false;

    if(lpNumberOfBytesWritten)
        *lpNumberOfBytesWritten = (size_t) result;

    return (((size_t) result) == nSize);
}